

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  AABBNodeMB4D *node1;
  ulong uVar55;
  long lVar56;
  uint uVar57;
  int iVar58;
  ulong uVar59;
  long lVar60;
  ulong *puVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  Scene *pSVar70;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  RTCIntersectArguments *pRVar77;
  ulong uVar78;
  ulong uVar79;
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar83 [32];
  float fVar90;
  float fVar91;
  float fVar97;
  float fVar98;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar107;
  float fVar111;
  undefined1 auVar106 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar122;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar123;
  float fVar132;
  float fVar133;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar130 [32];
  float fVar134;
  undefined1 auVar131 [32];
  float fVar138;
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar151;
  float fVar153;
  float fVar155;
  undefined1 auVar142 [32];
  float fVar144;
  float fVar146;
  float fVar150;
  float fVar152;
  float fVar154;
  undefined1 auVar143 [64];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar167;
  float fVar171;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [64];
  float fVar173;
  undefined1 auVar172 [64];
  float fVar174;
  undefined1 auVar175 [32];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar176 [64];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  float fVar191;
  undefined1 auVar192 [32];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar193 [64];
  float fVar200;
  float fVar201;
  undefined1 auVar202 [32];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar203 [64];
  float fVar216;
  float fVar218;
  undefined1 auVar217 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  float fVar222;
  float fVar223;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar224 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_df4;
  Scene *local_df0;
  RayQueryContext *local_de8;
  undefined8 local_de0;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  float fStack_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float fStack_da8;
  float fStack_da4;
  undefined1 local_d90 [8];
  float fStack_d88;
  float fStack_d84;
  undefined1 local_d80 [8];
  float fStack_d78;
  float fStack_d74;
  undefined1 local_d70 [16];
  undefined1 local_d60 [16];
  undefined1 local_d50 [16];
  undefined1 local_d40 [16];
  undefined1 local_d30 [16];
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [16];
  undefined1 local_ce0 [16];
  long local_cc8;
  ulong local_cc0;
  ulong local_cb8;
  long local_cb0;
  ulong local_ca8;
  undefined4 local_ca0;
  undefined4 local_c9c;
  float local_c98;
  undefined4 local_c94;
  undefined4 local_c90;
  undefined4 local_c8c;
  uint local_c88;
  uint local_c84;
  uint local_c80;
  RTCFilterFunctionNArguments local_c70;
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b60 [32];
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined4 uStack_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  ulong local_800 [250];
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar123 = ray->tfar;
    if (0.0 <= fVar123) {
      local_de8 = context;
      puVar61 = local_800 + 1;
      aVar5 = (ray->dir).field_0;
      auVar81 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar94._8_4_ = 0x7fffffff;
      auVar94._0_8_ = 0x7fffffff7fffffff;
      auVar94._12_4_ = 0x7fffffff;
      auVar94 = vandps_avx((undefined1  [16])aVar5,auVar94);
      auVar124._8_4_ = 0x219392ef;
      auVar124._0_8_ = 0x219392ef219392ef;
      auVar124._12_4_ = 0x219392ef;
      auVar94 = vcmpps_avx(auVar94,auVar124,1);
      auVar125._8_4_ = 0x3f800000;
      auVar125._0_8_ = 0x3f8000003f800000;
      auVar125._12_4_ = 0x3f800000;
      auVar124 = vdivps_avx(auVar125,(undefined1  [16])aVar5);
      auVar126._8_4_ = 0x5d5e0b6b;
      auVar126._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar126._12_4_ = 0x5d5e0b6b;
      auVar94 = vblendvps_avx(auVar124,auVar126,auVar94);
      auVar112._0_4_ = auVar94._0_4_ * 0.99999964;
      auVar112._4_4_ = auVar94._4_4_ * 0.99999964;
      auVar112._8_4_ = auVar94._8_4_ * 0.99999964;
      auVar112._12_4_ = auVar94._12_4_ * 0.99999964;
      auVar99._0_4_ = auVar94._0_4_ * 1.0000004;
      auVar99._4_4_ = auVar94._4_4_ * 1.0000004;
      auVar99._8_4_ = auVar94._8_4_ * 1.0000004;
      auVar99._12_4_ = auVar94._12_4_ * 1.0000004;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_ce0._4_4_ = uVar3;
      local_ce0._0_4_ = uVar3;
      local_ce0._8_4_ = uVar3;
      local_ce0._12_4_ = uVar3;
      auVar164 = ZEXT1664(local_ce0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_cf0._4_4_ = uVar3;
      local_cf0._0_4_ = uVar3;
      local_cf0._8_4_ = uVar3;
      local_cf0._12_4_ = uVar3;
      auVar172 = ZEXT1664(local_cf0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_d00._4_4_ = uVar3;
      local_d00._0_4_ = uVar3;
      local_d00._8_4_ = uVar3;
      local_d00._12_4_ = uVar3;
      auVar176 = ZEXT1664(local_d00);
      local_d10 = vshufps_avx(auVar112,auVar112,0);
      auVar190 = ZEXT1664(local_d10);
      auVar94 = vmovshdup_avx(auVar112);
      local_d20 = vshufps_avx(auVar112,auVar112,0x55);
      auVar193 = ZEXT1664(local_d20);
      auVar124 = vshufpd_avx(auVar112,auVar112,1);
      local_d30 = vshufps_avx(auVar112,auVar112,0xaa);
      auVar203 = ZEXT1664(local_d30);
      local_d40 = vshufps_avx(auVar99,auVar99,0);
      auVar217 = ZEXT1664(local_d40);
      local_d50 = vshufps_avx(auVar99,auVar99,0x55);
      auVar221 = ZEXT1664(local_d50);
      local_d60 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar224 = ZEXT1664(local_d60);
      uVar73 = (ulong)(auVar112._0_4_ < 0.0) * 0x10;
      uVar78 = (ulong)(auVar94._0_4_ < 0.0) << 4 | 0x20;
      uVar79 = (ulong)(auVar124._0_4_ < 0.0) << 4 | 0x40;
      local_d70 = vshufps_avx(auVar81,auVar81,0);
      auVar143 = ZEXT1664(local_d70);
      local_a50 = vshufps_avx(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),0);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._0_16_;
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = 0x3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f800000;
      auVar104._20_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f800000;
      auVar83._8_4_ = 0xbf800000;
      auVar83._0_8_ = 0xbf800000bf800000;
      auVar83._12_4_ = 0xbf800000;
      auVar83._16_4_ = 0xbf800000;
      auVar83._20_4_ = 0xbf800000;
      auVar83._24_4_ = 0xbf800000;
      auVar83._28_4_ = 0xbf800000;
      local_a40 = vblendvps_avx(auVar104,auVar83,local_a20);
LAB_00b7d927:
      if (puVar61 != local_800) {
        uVar62 = puVar61[-1];
        puVar61 = puVar61 + -1;
        do {
          fVar123 = (ray->dir).field_0.m128[3];
          auVar81._4_4_ = fVar123;
          auVar81._0_4_ = fVar123;
          auVar81._8_4_ = fVar123;
          auVar81._12_4_ = fVar123;
          do {
            if ((uVar62 & 8) != 0) {
              local_cc8 = (ulong)((uint)uVar62 & 0xf) - 8;
              uVar62 = uVar62 & 0xfffffffffffffff0;
              lVar63 = 0;
              goto LAB_00b7dac3;
            }
            uVar55 = uVar62 & 0xfffffffffffffff0;
            pfVar2 = (float *)(uVar55 + 0x80 + uVar73);
            pfVar1 = (float *)(uVar55 + 0x20 + uVar73);
            auVar92._0_4_ = fVar123 * *pfVar2 + *pfVar1;
            auVar92._4_4_ = fVar123 * pfVar2[1] + pfVar1[1];
            auVar92._8_4_ = fVar123 * pfVar2[2] + pfVar1[2];
            auVar92._12_4_ = fVar123 * pfVar2[3] + pfVar1[3];
            auVar94 = vsubps_avx(auVar92,auVar164._0_16_);
            auVar93._0_4_ = auVar190._0_4_ * auVar94._0_4_;
            auVar93._4_4_ = auVar190._4_4_ * auVar94._4_4_;
            auVar93._8_4_ = auVar190._8_4_ * auVar94._8_4_;
            auVar93._12_4_ = auVar190._12_4_ * auVar94._12_4_;
            pfVar2 = (float *)(uVar55 + 0x80 + uVar78);
            auVar94 = vmaxps_avx(auVar143._0_16_,auVar93);
            pfVar1 = (float *)(uVar55 + 0x20 + uVar78);
            auVar100._0_4_ = fVar123 * *pfVar2 + *pfVar1;
            auVar100._4_4_ = fVar123 * pfVar2[1] + pfVar1[1];
            auVar100._8_4_ = fVar123 * pfVar2[2] + pfVar1[2];
            auVar100._12_4_ = fVar123 * pfVar2[3] + pfVar1[3];
            auVar124 = vsubps_avx(auVar100,auVar172._0_16_);
            pfVar2 = (float *)(uVar55 + 0x80 + uVar79);
            pfVar1 = (float *)(uVar55 + 0x20 + uVar79);
            auVar113._0_4_ = fVar123 * *pfVar2 + *pfVar1;
            auVar113._4_4_ = fVar123 * pfVar2[1] + pfVar1[1];
            auVar113._8_4_ = fVar123 * pfVar2[2] + pfVar1[2];
            auVar113._12_4_ = fVar123 * pfVar2[3] + pfVar1[3];
            auVar101._0_4_ = auVar193._0_4_ * auVar124._0_4_;
            auVar101._4_4_ = auVar193._4_4_ * auVar124._4_4_;
            auVar101._8_4_ = auVar193._8_4_ * auVar124._8_4_;
            auVar101._12_4_ = auVar193._12_4_ * auVar124._12_4_;
            auVar124 = vsubps_avx(auVar113,auVar176._0_16_);
            auVar114._0_4_ = auVar203._0_4_ * auVar124._0_4_;
            auVar114._4_4_ = auVar203._4_4_ * auVar124._4_4_;
            auVar114._8_4_ = auVar203._8_4_ * auVar124._8_4_;
            auVar114._12_4_ = auVar203._12_4_ * auVar124._12_4_;
            auVar124 = vmaxps_avx(auVar101,auVar114);
            pfVar2 = (float *)(uVar55 + 0x80 + (uVar73 ^ 0x10));
            pfVar1 = (float *)(uVar55 + 0x20 + (uVar73 ^ 0x10));
            auVar115._0_4_ = fVar123 * *pfVar2 + *pfVar1;
            auVar115._4_4_ = fVar123 * pfVar2[1] + pfVar1[1];
            auVar115._8_4_ = fVar123 * pfVar2[2] + pfVar1[2];
            auVar115._12_4_ = fVar123 * pfVar2[3] + pfVar1[3];
            auVar94 = vmaxps_avx(auVar94,auVar124);
            auVar124 = vsubps_avx(auVar115,auVar164._0_16_);
            auVar102._0_4_ = auVar217._0_4_ * auVar124._0_4_;
            auVar102._4_4_ = auVar217._4_4_ * auVar124._4_4_;
            auVar102._8_4_ = auVar217._8_4_ * auVar124._8_4_;
            auVar102._12_4_ = auVar217._12_4_ * auVar124._12_4_;
            auVar124 = vminps_avx(local_a50,auVar102);
            pfVar2 = (float *)(uVar55 + 0x80 + (uVar78 ^ 0x10));
            pfVar1 = (float *)(uVar55 + 0x20 + (uVar78 ^ 0x10));
            auVar116._0_4_ = fVar123 * *pfVar2 + *pfVar1;
            auVar116._4_4_ = fVar123 * pfVar2[1] + pfVar1[1];
            auVar116._8_4_ = fVar123 * pfVar2[2] + pfVar1[2];
            auVar116._12_4_ = fVar123 * pfVar2[3] + pfVar1[3];
            auVar99 = vsubps_avx(auVar116,auVar172._0_16_);
            auVar117._0_4_ = auVar221._0_4_ * auVar99._0_4_;
            auVar117._4_4_ = auVar221._4_4_ * auVar99._4_4_;
            auVar117._8_4_ = auVar221._8_4_ * auVar99._8_4_;
            auVar117._12_4_ = auVar221._12_4_ * auVar99._12_4_;
            pfVar2 = (float *)(uVar55 + 0x80 + (uVar79 ^ 0x10));
            pfVar1 = (float *)(uVar55 + 0x20 + (uVar79 ^ 0x10));
            auVar127._0_4_ = fVar123 * *pfVar2 + *pfVar1;
            auVar127._4_4_ = fVar123 * pfVar2[1] + pfVar1[1];
            auVar127._8_4_ = fVar123 * pfVar2[2] + pfVar1[2];
            auVar127._12_4_ = fVar123 * pfVar2[3] + pfVar1[3];
            auVar99 = vsubps_avx(auVar127,auVar176._0_16_);
            auVar128._0_4_ = auVar224._0_4_ * auVar99._0_4_;
            auVar128._4_4_ = auVar224._4_4_ * auVar99._4_4_;
            auVar128._8_4_ = auVar224._8_4_ * auVar99._8_4_;
            auVar128._12_4_ = auVar224._12_4_ * auVar99._12_4_;
            auVar99 = vminps_avx(auVar117,auVar128);
            auVar124 = vminps_avx(auVar124,auVar99);
            auVar94 = vcmpps_avx(auVar94,auVar124,2);
            if (((uint)uVar62 & 7) == 6) {
              auVar124 = vcmpps_avx(*(undefined1 (*) [16])(uVar55 + 0xe0),auVar81,2);
              auVar99 = vcmpps_avx(auVar81,*(undefined1 (*) [16])(uVar55 + 0xf0),1);
              auVar124 = vandps_avx(auVar124,auVar99);
              auVar94 = vandps_avx(auVar124,auVar94);
            }
            auVar94 = vpslld_avx(auVar94,0x1f);
            uVar57 = vmovmskps_avx(auVar94);
            if (uVar57 == 0) goto LAB_00b7d927;
            uVar57 = uVar57 & 0xff;
            lVar63 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
              }
            }
            uVar62 = *(ulong *)(uVar55 + lVar63 * 8);
            uVar57 = uVar57 - 1 & uVar57;
            uVar59 = (ulong)uVar57;
          } while (uVar57 == 0);
          do {
            *puVar61 = uVar62;
            puVar61 = puVar61 + 1;
            lVar63 = 0;
            if (uVar59 != 0) {
              for (; (uVar59 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
              }
            }
            uVar62 = *(ulong *)(uVar55 + lVar63 * 8);
            uVar59 = uVar59 - 1 & uVar59;
          } while (uVar59 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00b7dac3:
  if (lVar63 == local_cc8) goto LAB_00b7d927;
  lVar56 = lVar63 * 0x60;
  pSVar70 = local_de8->scene;
  local_df0 = pSVar70;
  pRVar6 = (pSVar70->geometries).items;
  pGVar7 = pRVar6[*(uint *)(uVar62 + 0x40 + lVar56)].ptr;
  fVar123 = (pGVar7->time_range).lower;
  fVar123 = pGVar7->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar123) / ((pGVar7->time_range).upper - fVar123));
  auVar94 = vroundss_avx(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),9);
  auVar94 = vminss_avx(auVar94,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar219 = vmaxss_avx(ZEXT816(0) << 0x20,auVar94);
  iVar58 = (int)auVar219._0_4_;
  lVar71 = (long)iVar58 * 0x38;
  lVar8 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar71);
  uVar74 = (ulong)*(uint *)(uVar62 + 4 + lVar56);
  auVar94 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar62 + lVar56) * 4);
  uVar64 = (ulong)*(uint *)(uVar62 + 0x10 + lVar56);
  auVar124 = *(undefined1 (*) [16])(lVar8 + uVar64 * 4);
  uVar65 = (ulong)*(uint *)(uVar62 + 0x20 + lVar56);
  auVar81 = *(undefined1 (*) [16])(lVar8 + uVar65 * 4);
  uVar66 = (ulong)*(uint *)(uVar62 + 0x30 + lVar56);
  auVar99 = *(undefined1 (*) [16])(lVar8 + uVar66 * 4);
  local_cb0 = *(long *)&pRVar6[*(uint *)(uVar62 + 0x44 + lVar56)].ptr[2].numPrimitives;
  lVar8 = *(long *)(local_cb0 + lVar71);
  auVar112 = *(undefined1 (*) [16])(lVar8 + uVar74 * 4);
  uVar67 = (ulong)*(uint *)(uVar62 + 0x14 + lVar56);
  auVar125 = *(undefined1 (*) [16])(lVar8 + uVar67 * 4);
  uVar68 = (ulong)*(uint *)(uVar62 + 0x24 + lVar56);
  auVar126 = *(undefined1 (*) [16])(lVar8 + uVar68 * 4);
  uVar69 = (ulong)*(uint *)(uVar62 + 0x34 + lVar56);
  auVar82 = *(undefined1 (*) [16])(lVar8 + uVar69 * 4);
  lVar8 = *(long *)&pRVar6[*(uint *)(uVar62 + 0x48 + lVar56)].ptr[2].numPrimitives;
  lVar9 = *(long *)(lVar8 + lVar71);
  uVar59 = (ulong)*(uint *)(uVar62 + 8 + lVar56);
  auVar129 = *(undefined1 (*) [16])(lVar9 + uVar59 * 4);
  local_ca8 = (ulong)*(uint *)(uVar62 + 0x18 + lVar56);
  auVar103 = *(undefined1 (*) [16])(lVar9 + local_ca8 * 4);
  uVar75 = CONCAT44(0,*(uint *)(uVar62 + 0x28 + lVar56));
  local_be0._0_8_ = uVar75;
  auVar140 = *(undefined1 (*) [16])(lVar9 + uVar75 * 4);
  uVar76 = (ulong)*(uint *)(uVar62 + 0x38 + lVar56);
  auVar160 = *(undefined1 (*) [16])(lVar9 + uVar76 * 4);
  fVar123 = fVar123 - auVar219._0_4_;
  lVar9 = *(long *)&pRVar6[*(uint *)(uVar62 + 0x4c + lVar56)].ptr[2].numPrimitives;
  lVar71 = *(long *)(lVar9 + lVar71);
  uVar55 = (ulong)*(uint *)(uVar62 + 0xc + lVar56);
  auVar219 = *(undefined1 (*) [16])(lVar71 + uVar55 * 4);
  local_cc0 = (ulong)*(uint *)(uVar62 + 0x1c + lVar56);
  auVar92 = *(undefined1 (*) [16])(lVar71 + local_cc0 * 4);
  auVar93 = vunpcklps_avx(auVar94,auVar129);
  auVar129 = vunpckhps_avx(auVar94,auVar129);
  auVar100 = vunpcklps_avx(auVar112,auVar219);
  auVar112 = vunpckhps_avx(auVar112,auVar219);
  uVar72 = (ulong)*(uint *)(uVar62 + 0x2c + lVar56);
  auVar94 = *(undefined1 (*) [16])(lVar71 + uVar72 * 4);
  auVar219 = vunpcklps_avx(auVar129,auVar112);
  _local_a60 = vunpcklps_avx(auVar93,auVar100);
  auVar54 = _local_a60;
  auVar112 = vunpckhps_avx(auVar93,auVar100);
  auVar93 = vunpcklps_avx(auVar124,auVar103);
  auVar129 = vunpckhps_avx(auVar124,auVar103);
  auVar103 = vunpcklps_avx(auVar125,auVar92);
  auVar125 = vunpckhps_avx(auVar125,auVar92);
  local_cb8 = (ulong)*(uint *)(uVar62 + 0x3c + lVar56);
  auVar124 = *(undefined1 (*) [16])(lVar71 + local_cb8 * 4);
  auVar129 = vunpcklps_avx(auVar129,auVar125);
  auVar92 = vunpcklps_avx(auVar93,auVar103);
  auVar125 = vunpckhps_avx(auVar93,auVar103);
  auVar103 = vunpcklps_avx(auVar81,auVar140);
  auVar81 = vunpckhps_avx(auVar81,auVar140);
  auVar140 = vunpcklps_avx(auVar126,auVar94);
  auVar126 = vunpckhps_avx(auVar126,auVar94);
  lVar60 = (long)(iVar58 + 1) * 0x38;
  lVar71 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar60);
  auVar94 = *(undefined1 (*) [16])(lVar71 + (ulong)*(uint *)(uVar62 + lVar56) * 4);
  _local_d80 = vunpcklps_avx(auVar81,auVar126);
  auVar127 = _local_d80;
  _local_a90 = vunpcklps_avx(auVar103,auVar140);
  auVar128 = _local_a90;
  _local_a80 = vunpckhps_avx(auVar103,auVar140);
  auVar52 = _local_a80;
  auVar126 = vunpcklps_avx(auVar99,auVar160);
  auVar81 = vunpckhps_avx(auVar99,auVar160);
  auVar103 = vunpcklps_avx(auVar82,auVar124);
  auVar99 = vunpckhps_avx(auVar82,auVar124);
  lVar8 = *(long *)(lVar8 + lVar60);
  auVar124 = *(undefined1 (*) [16])(lVar8 + uVar59 * 4);
  _local_d90 = vunpcklps_avx(auVar81,auVar99);
  auVar117 = _local_d90;
  auVar140 = vunpcklps_avx(auVar126,auVar103);
  _local_a70 = vunpckhps_avx(auVar126,auVar103);
  auVar53 = _local_a70;
  lVar10 = *(long *)(local_cb0 + lVar60);
  auVar99 = vunpcklps_avx(auVar94,auVar124);
  auVar81 = vunpckhps_avx(auVar94,auVar124);
  auVar94 = *(undefined1 (*) [16])(lVar10 + uVar74 * 4);
  lVar9 = *(long *)(lVar9 + lVar60);
  auVar124 = *(undefined1 (*) [16])(lVar9 + uVar55 * 4);
  auVar126 = vunpcklps_avx(auVar94,auVar124);
  auVar94 = vunpckhps_avx(auVar94,auVar124);
  auVar103 = vunpcklps_avx(auVar81,auVar94);
  auVar160 = vunpcklps_avx(auVar99,auVar126);
  auVar81 = vunpckhps_avx(auVar99,auVar126);
  auVar94 = *(undefined1 (*) [16])(lVar71 + uVar64 * 4);
  auVar124 = *(undefined1 (*) [16])(lVar8 + local_ca8 * 4);
  auVar126 = vunpcklps_avx(auVar94,auVar124);
  auVar99 = vunpckhps_avx(auVar94,auVar124);
  auVar94 = *(undefined1 (*) [16])(lVar10 + uVar67 * 4);
  auVar124 = *(undefined1 (*) [16])(lVar9 + local_cc0 * 4);
  auVar82 = vunpcklps_avx(auVar94,auVar124);
  auVar94 = vunpckhps_avx(auVar94,auVar124);
  auVar93 = vunpcklps_avx(auVar99,auVar94);
  auVar100 = vunpcklps_avx(auVar126,auVar82);
  auVar99 = vunpckhps_avx(auVar126,auVar82);
  auVar94 = *(undefined1 (*) [16])(lVar71 + uVar65 * 4);
  auVar124 = *(undefined1 (*) [16])(lVar8 + uVar75 * 4);
  auVar82 = vunpcklps_avx(auVar94,auVar124);
  auVar126 = vunpckhps_avx(auVar94,auVar124);
  auVar94 = *(undefined1 (*) [16])(lVar10 + uVar68 * 4);
  auVar124 = *(undefined1 (*) [16])(lVar9 + uVar72 * 4);
  auVar101 = vunpcklps_avx(auVar94,auVar124);
  auVar94 = vunpckhps_avx(auVar94,auVar124);
  auVar102 = vunpcklps_avx(auVar126,auVar94);
  auVar113 = vunpcklps_avx(auVar82,auVar101);
  auVar126 = vunpckhps_avx(auVar82,auVar101);
  auVar94 = *(undefined1 (*) [16])(lVar71 + uVar66 * 4);
  auVar124 = *(undefined1 (*) [16])(lVar8 + uVar76 * 4);
  auVar101 = vunpcklps_avx(auVar94,auVar124);
  auVar82 = vunpckhps_avx(auVar94,auVar124);
  auVar94 = *(undefined1 (*) [16])(lVar10 + uVar69 * 4);
  auVar124 = *(undefined1 (*) [16])(lVar9 + local_cb8 * 4);
  auVar114 = vunpcklps_avx(auVar94,auVar124);
  auVar94 = vunpckhps_avx(auVar94,auVar124);
  auVar115 = vunpcklps_avx(auVar82,auVar94);
  auVar116 = vunpcklps_avx(auVar101,auVar114);
  auVar82 = vunpckhps_avx(auVar101,auVar114);
  auVar94 = vshufps_avx(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),0);
  auVar124 = vshufps_avx(ZEXT416((uint)(1.0 - fVar123)),ZEXT416((uint)(1.0 - fVar123)),0);
  fVar123 = auVar94._0_4_;
  fVar14 = auVar94._4_4_;
  fVar15 = auVar94._8_4_;
  fVar16 = auVar94._12_4_;
  fVar90 = auVar124._0_4_;
  fVar97 = auVar124._4_4_;
  fVar98 = auVar124._8_4_;
  fVar107 = auVar124._12_4_;
  auVar95._4_4_ = fVar97 * (float)local_a60._4_4_ + auVar160._4_4_ * fVar14;
  auVar95._0_4_ = fVar90 * (float)local_a60._0_4_ + auVar160._0_4_ * fVar123;
  auVar95._8_4_ = fVar98 * fStack_a58 + auVar160._8_4_ * fVar15;
  auVar95._12_4_ = fVar107 * fStack_a54 + auVar160._12_4_ * fVar16;
  local_ba0._0_4_ = auVar112._0_4_;
  local_ba0._4_4_ = auVar112._4_4_;
  fStack_b98 = auVar112._8_4_;
  fStack_b94 = auVar112._12_4_;
  auVar118._4_4_ = fVar97 * (float)local_ba0._4_4_ + fVar14 * auVar81._4_4_;
  auVar118._0_4_ = fVar90 * (float)local_ba0._0_4_ + fVar123 * auVar81._0_4_;
  auVar118._8_4_ = fVar98 * fStack_b98 + fVar15 * auVar81._8_4_;
  auVar118._12_4_ = fVar107 * fStack_b94 + fVar16 * auVar81._12_4_;
  local_b40._0_4_ = auVar219._0_4_;
  local_b40._4_4_ = auVar219._4_4_;
  fStack_b38 = auVar219._8_4_;
  fStack_b34 = auVar219._12_4_;
  auVar156._4_4_ = fVar97 * (float)local_b40._4_4_ + auVar103._4_4_ * fVar14;
  auVar156._0_4_ = fVar90 * (float)local_b40._0_4_ + auVar103._0_4_ * fVar123;
  auVar156._8_4_ = fVar98 * fStack_b38 + auVar103._8_4_ * fVar15;
  auVar156._12_4_ = fVar107 * fStack_b34 + auVar103._12_4_ * fVar16;
  local_bc0._0_4_ = auVar92._0_4_;
  local_bc0._4_4_ = auVar92._4_4_;
  fStack_bb8 = auVar92._8_4_;
  fStack_bb4 = auVar92._12_4_;
  auVar160._0_4_ = fVar90 * (float)local_bc0._0_4_ + fVar123 * auVar100._0_4_;
  auVar160._4_4_ = fVar97 * (float)local_bc0._4_4_ + fVar14 * auVar100._4_4_;
  auVar160._8_4_ = fVar98 * fStack_bb8 + fVar15 * auVar100._8_4_;
  auVar160._12_4_ = fVar107 * fStack_bb4 + fVar16 * auVar100._12_4_;
  local_b80._0_4_ = auVar125._0_4_;
  local_b80._4_4_ = auVar125._4_4_;
  fStack_b78 = auVar125._8_4_;
  fStack_b74 = auVar125._12_4_;
  auVar103._0_4_ = fVar90 * (float)local_b80._0_4_ + auVar99._0_4_ * fVar123;
  auVar103._4_4_ = fVar97 * (float)local_b80._4_4_ + auVar99._4_4_ * fVar14;
  auVar103._8_4_ = fVar98 * fStack_b78 + auVar99._8_4_ * fVar15;
  auVar103._12_4_ = fVar107 * fStack_b74 + auVar99._12_4_ * fVar16;
  local_b20._0_4_ = auVar129._0_4_;
  local_b20._4_4_ = auVar129._4_4_;
  fStack_b18 = auVar129._8_4_;
  fStack_b14 = auVar129._12_4_;
  auVar219._0_4_ = fVar90 * (float)local_b20._0_4_ + auVar93._0_4_ * fVar123;
  auVar219._4_4_ = fVar97 * (float)local_b20._4_4_ + auVar93._4_4_ * fVar14;
  auVar219._8_4_ = fVar98 * fStack_b18 + auVar93._8_4_ * fVar15;
  auVar219._12_4_ = fVar107 * fStack_b14 + auVar93._12_4_ * fVar16;
  auVar95._20_4_ = fVar97 * (float)local_a90._4_4_ + fVar14 * auVar113._4_4_;
  auVar95._16_4_ = fVar90 * (float)local_a90._0_4_ + fVar123 * auVar113._0_4_;
  auVar95._24_4_ = fVar98 * fStack_a88 + fVar15 * auVar113._8_4_;
  auVar95._28_4_ = fVar107 * fStack_a84 + fVar16 * auVar113._12_4_;
  auVar118._20_4_ = fVar97 * (float)local_a80._4_4_ + auVar126._4_4_ * fVar14;
  auVar118._16_4_ = fVar90 * (float)local_a80._0_4_ + auVar126._0_4_ * fVar123;
  auVar118._24_4_ = fVar98 * fStack_a78 + auVar126._8_4_ * fVar15;
  auVar118._28_4_ = fVar107 * fStack_a74 + auVar126._12_4_ * fVar16;
  auVar156._20_4_ = fVar97 * (float)local_d80._4_4_ + auVar102._4_4_ * fVar14;
  auVar156._16_4_ = fVar90 * (float)local_d80._0_4_ + auVar102._0_4_ * fVar123;
  auVar156._24_4_ = fVar98 * fStack_d78 + auVar102._8_4_ * fVar15;
  auVar156._28_4_ = fVar107 * fStack_d74 + auVar102._12_4_ * fVar16;
  lVar8 = uVar62 + 0x40 + lVar56;
  local_9e0 = *(undefined8 *)(lVar8 + 0x10);
  uStack_9d8 = *(undefined8 *)(lVar8 + 0x18);
  auVar129._0_4_ = auVar140._0_4_ * fVar90 + fVar123 * auVar116._0_4_;
  auVar129._4_4_ = auVar140._4_4_ * fVar97 + fVar14 * auVar116._4_4_;
  auVar129._8_4_ = auVar140._8_4_ * fVar98 + fVar15 * auVar116._8_4_;
  auVar129._12_4_ = auVar140._12_4_ * fVar107 + fVar16 * auVar116._12_4_;
  uStack_9d0 = local_9e0;
  uStack_9c8 = uStack_9d8;
  lVar56 = uVar62 + 0x50 + lVar56;
  local_a00 = *(undefined8 *)(lVar56 + 0x10);
  uStack_9f8 = *(undefined8 *)(lVar56 + 0x18);
  auVar140._0_4_ = fVar90 * (float)local_a70._0_4_ + fVar123 * auVar82._0_4_;
  auVar140._4_4_ = fVar97 * (float)local_a70._4_4_ + fVar14 * auVar82._4_4_;
  auVar140._8_4_ = fVar98 * fStack_a68 + fVar15 * auVar82._8_4_;
  auVar140._12_4_ = fVar107 * fStack_a64 + fVar16 * auVar82._12_4_;
  auVar82._0_4_ = fVar90 * (float)local_d90._0_4_ + fVar123 * auVar115._0_4_;
  auVar82._4_4_ = fVar97 * (float)local_d90._4_4_ + fVar14 * auVar115._4_4_;
  auVar82._8_4_ = fVar98 * fStack_d88 + fVar15 * auVar115._8_4_;
  auVar82._12_4_ = fVar107 * fStack_d84 + fVar16 * auVar115._12_4_;
  uStack_9f0 = local_a00;
  uStack_9e8 = uStack_9f8;
  auVar161._16_16_ = auVar160;
  auVar161._0_16_ = auVar160;
  auVar105._16_16_ = auVar103;
  auVar105._0_16_ = auVar103;
  auVar220._16_16_ = auVar219;
  auVar220._0_16_ = auVar219;
  auVar130._16_16_ = auVar129;
  auVar130._0_16_ = auVar129;
  auVar141._16_16_ = auVar140;
  auVar141._0_16_ = auVar140;
  auVar175._16_16_ = auVar82;
  auVar175._0_16_ = auVar82;
  uVar3 = *(undefined4 *)&(ray->org).field_0;
  auVar189._4_4_ = uVar3;
  auVar189._0_4_ = uVar3;
  auVar189._8_4_ = uVar3;
  auVar189._12_4_ = uVar3;
  auVar189._16_4_ = uVar3;
  auVar189._20_4_ = uVar3;
  auVar189._24_4_ = uVar3;
  auVar189._28_4_ = uVar3;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar192._4_4_ = uVar4;
  auVar192._0_4_ = uVar4;
  auVar192._8_4_ = uVar4;
  auVar192._12_4_ = uVar4;
  auVar192._16_4_ = uVar4;
  auVar192._20_4_ = uVar4;
  auVar192._24_4_ = uVar4;
  auVar192._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar202._4_4_ = uVar4;
  auVar202._0_4_ = uVar4;
  auVar202._8_4_ = uVar4;
  auVar202._12_4_ = uVar4;
  auVar202._16_4_ = uVar4;
  auVar202._20_4_ = uVar4;
  auVar202._24_4_ = uVar4;
  auVar202._28_4_ = uVar4;
  local_c00 = vsubps_avx(auVar95,auVar189);
  local_c20 = vsubps_avx(auVar118,auVar192);
  local_c40 = vsubps_avx(auVar156,auVar202);
  auVar83 = vsubps_avx(auVar161,auVar189);
  auVar104 = vsubps_avx(auVar105,auVar192);
  auVar17 = vsubps_avx(auVar220,auVar202);
  auVar95 = vsubps_avx(auVar130,auVar189);
  auVar18 = vsubps_avx(auVar141,auVar192);
  auVar19 = vsubps_avx(auVar175,auVar202);
  local_ac0 = vsubps_avx(auVar95,local_c00);
  local_ae0 = vsubps_avx(auVar18,local_c20);
  _local_b20 = vsubps_avx(auVar19,local_c40);
  fVar14 = local_c20._0_4_;
  fVar123 = auVar18._0_4_ + fVar14;
  fVar16 = local_c20._4_4_;
  fVar132 = auVar18._4_4_ + fVar16;
  fVar97 = local_c20._8_4_;
  fVar133 = auVar18._8_4_ + fVar97;
  fVar107 = local_c20._12_4_;
  fVar134 = auVar18._12_4_ + fVar107;
  fVar109 = local_c20._16_4_;
  fVar135 = auVar18._16_4_ + fVar109;
  fVar111 = local_c20._20_4_;
  fVar136 = auVar18._20_4_ + fVar111;
  fVar12 = local_c20._24_4_;
  fVar137 = auVar18._24_4_ + fVar12;
  fVar91 = local_c20._28_4_;
  fVar222 = local_c40._0_4_;
  fVar138 = fVar222 + auVar19._0_4_;
  fVar225 = local_c40._4_4_;
  fVar144 = fVar225 + auVar19._4_4_;
  fVar227 = local_c40._8_4_;
  fVar146 = fVar227 + auVar19._8_4_;
  fVar229 = local_c40._12_4_;
  fVar148 = fVar229 + auVar19._12_4_;
  fVar231 = local_c40._16_4_;
  fVar150 = fVar231 + auVar19._16_4_;
  fVar233 = local_c40._20_4_;
  fVar152 = fVar233 + auVar19._20_4_;
  fVar235 = local_c40._24_4_;
  fVar154 = fVar235 + auVar19._24_4_;
  fVar122 = local_c40._28_4_;
  fVar80 = local_b20._0_4_;
  fVar84 = local_b20._4_4_;
  auVar20._4_4_ = fVar84 * fVar132;
  auVar20._0_4_ = fVar80 * fVar123;
  fVar85 = local_b20._8_4_;
  auVar20._8_4_ = fVar85 * fVar133;
  fVar86 = local_b20._12_4_;
  auVar20._12_4_ = fVar86 * fVar134;
  fVar87 = local_b20._16_4_;
  auVar20._16_4_ = fVar87 * fVar135;
  fVar88 = local_b20._20_4_;
  auVar20._20_4_ = fVar88 * fVar136;
  fVar89 = local_b20._24_4_;
  auVar20._24_4_ = fVar89 * fVar137;
  auVar20._28_4_ = auVar160._12_4_;
  fVar200 = local_ae0._0_4_;
  fVar204 = local_ae0._4_4_;
  auVar21._4_4_ = fVar204 * fVar144;
  auVar21._0_4_ = fVar200 * fVar138;
  fVar206 = local_ae0._8_4_;
  auVar21._8_4_ = fVar206 * fVar146;
  fVar208 = local_ae0._12_4_;
  auVar21._12_4_ = fVar208 * fVar148;
  fVar210 = local_ae0._16_4_;
  auVar21._16_4_ = fVar210 * fVar150;
  fVar212 = local_ae0._20_4_;
  auVar21._20_4_ = fVar212 * fVar152;
  fVar214 = local_ae0._24_4_;
  auVar21._24_4_ = fVar214 * fVar154;
  auVar21._28_4_ = auVar82._12_4_;
  auVar20 = vsubps_avx(auVar21,auVar20);
  fVar15 = local_c00._0_4_;
  fVar159 = auVar95._0_4_ + fVar15;
  fVar90 = local_c00._4_4_;
  fVar165 = auVar95._4_4_ + fVar90;
  fVar98 = local_c00._8_4_;
  fVar166 = auVar95._8_4_ + fVar98;
  fVar108 = local_c00._12_4_;
  fVar167 = auVar95._12_4_ + fVar108;
  fVar110 = local_c00._16_4_;
  fVar168 = auVar95._16_4_ + fVar110;
  fVar11 = local_c00._20_4_;
  fVar169 = auVar95._20_4_ + fVar11;
  fVar13 = local_c00._24_4_;
  fVar170 = auVar95._24_4_ + fVar13;
  fVar191 = local_ac0._0_4_;
  fVar194 = local_ac0._4_4_;
  auVar22._4_4_ = fVar194 * fVar144;
  auVar22._0_4_ = fVar191 * fVar138;
  fVar195 = local_ac0._8_4_;
  auVar22._8_4_ = fVar195 * fVar146;
  fVar196 = local_ac0._12_4_;
  auVar22._12_4_ = fVar196 * fVar148;
  fVar197 = local_ac0._16_4_;
  auVar22._16_4_ = fVar197 * fVar150;
  fVar198 = local_ac0._20_4_;
  auVar22._20_4_ = fVar198 * fVar152;
  fVar199 = local_ac0._24_4_;
  auVar22._24_4_ = fVar199 * fVar154;
  auVar22._28_4_ = fVar122 + auVar19._28_4_;
  auVar105 = _local_b20;
  auVar23._4_4_ = fVar84 * fVar165;
  auVar23._0_4_ = fVar80 * fVar159;
  auVar23._8_4_ = fVar85 * fVar166;
  auVar23._12_4_ = fVar86 * fVar167;
  auVar23._16_4_ = fVar87 * fVar168;
  auVar23._20_4_ = fVar88 * fVar169;
  auVar23._24_4_ = fVar89 * fVar170;
  auVar23._28_4_ = uVar3;
  auVar21 = vsubps_avx(auVar23,auVar22);
  auVar24._4_4_ = fVar204 * fVar165;
  auVar24._0_4_ = fVar200 * fVar159;
  auVar24._8_4_ = fVar206 * fVar166;
  auVar24._12_4_ = fVar208 * fVar167;
  auVar24._16_4_ = fVar210 * fVar168;
  auVar24._20_4_ = fVar212 * fVar169;
  auVar24._24_4_ = fVar214 * fVar170;
  auVar24._28_4_ = auVar95._28_4_ + local_c00._28_4_;
  auVar25._4_4_ = fVar194 * fVar132;
  auVar25._0_4_ = fVar191 * fVar123;
  auVar25._8_4_ = fVar195 * fVar133;
  auVar25._12_4_ = fVar196 * fVar134;
  auVar25._16_4_ = fVar197 * fVar135;
  auVar25._20_4_ = fVar198 * fVar136;
  auVar25._24_4_ = fVar199 * fVar137;
  auVar25._28_4_ = auVar18._28_4_ + fVar91;
  auVar22 = vsubps_avx(auVar25,auVar24);
  local_de0._4_4_ = (ray->dir).field_0.m128[1];
  fVar123 = (ray->dir).field_0.m128[2];
  local_b00._4_4_ = fVar123;
  local_b00._0_4_ = fVar123;
  local_b00._8_4_ = fVar123;
  local_b00._12_4_ = fVar123;
  local_b00._16_4_ = fVar123;
  local_b00._20_4_ = fVar123;
  local_b00._24_4_ = fVar123;
  local_b00._28_4_ = fVar123;
  local_dc0._4_4_ = (ray->dir).field_0.m128[0];
  local_b60._0_4_ =
       auVar20._0_4_ * local_dc0._4_4_ + local_de0._4_4_ * auVar21._0_4_ + fVar123 * auVar22._0_4_;
  local_b60._4_4_ =
       auVar20._4_4_ * local_dc0._4_4_ + local_de0._4_4_ * auVar21._4_4_ + fVar123 * auVar22._4_4_;
  local_b60._8_4_ =
       auVar20._8_4_ * local_dc0._4_4_ + local_de0._4_4_ * auVar21._8_4_ + fVar123 * auVar22._8_4_;
  local_b60._12_4_ =
       auVar20._12_4_ * local_dc0._4_4_ +
       local_de0._4_4_ * auVar21._12_4_ + fVar123 * auVar22._12_4_;
  local_b60._16_4_ =
       auVar20._16_4_ * local_dc0._4_4_ +
       local_de0._4_4_ * auVar21._16_4_ + fVar123 * auVar22._16_4_;
  local_b60._20_4_ =
       auVar20._20_4_ * local_dc0._4_4_ +
       local_de0._4_4_ * auVar21._20_4_ + fVar123 * auVar22._20_4_;
  local_b60._24_4_ =
       auVar20._24_4_ * local_dc0._4_4_ +
       local_de0._4_4_ * auVar21._24_4_ + fVar123 * auVar22._24_4_;
  local_b60._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar22._28_4_;
  auVar20 = vsubps_avx(local_c20,auVar104);
  _local_b40 = vsubps_avx(local_c40,auVar17);
  fVar132 = auVar104._0_4_ + fVar14;
  fVar133 = auVar104._4_4_ + fVar16;
  fVar134 = auVar104._8_4_ + fVar97;
  fVar135 = auVar104._12_4_ + fVar107;
  fVar136 = auVar104._16_4_ + fVar109;
  fVar137 = auVar104._20_4_ + fVar111;
  fVar138 = auVar104._24_4_ + fVar12;
  fVar173 = auVar104._28_4_;
  fVar144 = fVar222 + auVar17._0_4_;
  fVar146 = fVar225 + auVar17._4_4_;
  fVar148 = fVar227 + auVar17._8_4_;
  fVar150 = fVar229 + auVar17._12_4_;
  fVar152 = fVar231 + auVar17._16_4_;
  fVar154 = fVar233 + auVar17._20_4_;
  fVar159 = fVar235 + auVar17._24_4_;
  fVar201 = local_b40._0_4_;
  fVar205 = local_b40._4_4_;
  auVar26._4_4_ = fVar205 * fVar133;
  auVar26._0_4_ = fVar201 * fVar132;
  fVar207 = local_b40._8_4_;
  auVar26._8_4_ = fVar207 * fVar134;
  fVar209 = local_b40._12_4_;
  auVar26._12_4_ = fVar209 * fVar135;
  fVar211 = local_b40._16_4_;
  auVar26._16_4_ = fVar211 * fVar136;
  fVar213 = local_b40._20_4_;
  auVar26._20_4_ = fVar213 * fVar137;
  fVar215 = local_b40._24_4_;
  auVar26._24_4_ = fVar215 * fVar138;
  auVar26._28_4_ = fVar122;
  fVar174 = auVar20._0_4_;
  fVar177 = auVar20._4_4_;
  auVar27._4_4_ = fVar177 * fVar146;
  auVar27._0_4_ = fVar174 * fVar144;
  fVar179 = auVar20._8_4_;
  auVar27._8_4_ = fVar179 * fVar148;
  fVar181 = auVar20._12_4_;
  auVar27._12_4_ = fVar181 * fVar150;
  fVar183 = auVar20._16_4_;
  auVar27._16_4_ = fVar183 * fVar152;
  fVar185 = auVar20._20_4_;
  auVar27._20_4_ = fVar185 * fVar154;
  fVar187 = auVar20._24_4_;
  auVar27._24_4_ = fVar187 * fVar159;
  auVar27._28_4_ = fVar91;
  auVar21 = vsubps_avx(auVar27,auVar26);
  auVar22 = vsubps_avx(local_c00,auVar83);
  fVar223 = auVar22._0_4_;
  fVar226 = auVar22._4_4_;
  auVar28._4_4_ = fVar226 * fVar146;
  auVar28._0_4_ = fVar223 * fVar144;
  fVar228 = auVar22._8_4_;
  auVar28._8_4_ = fVar228 * fVar148;
  fVar230 = auVar22._12_4_;
  auVar28._12_4_ = fVar230 * fVar150;
  fVar232 = auVar22._16_4_;
  auVar28._16_4_ = fVar232 * fVar152;
  fVar234 = auVar22._20_4_;
  auVar28._20_4_ = fVar234 * fVar154;
  fVar236 = auVar22._24_4_;
  auVar28._24_4_ = fVar236 * fVar159;
  auVar28._28_4_ = fVar122 + auVar17._28_4_;
  fVar144 = auVar83._0_4_ + fVar15;
  fVar146 = auVar83._4_4_ + fVar90;
  fVar148 = auVar83._8_4_ + fVar98;
  fVar150 = auVar83._12_4_ + fVar108;
  fVar152 = auVar83._16_4_ + fVar110;
  fVar154 = auVar83._20_4_ + fVar11;
  fVar159 = auVar83._24_4_ + fVar13;
  fVar171 = auVar83._28_4_ + local_c00._28_4_;
  auVar29._4_4_ = fVar205 * fVar146;
  auVar29._0_4_ = fVar201 * fVar144;
  auVar29._8_4_ = fVar207 * fVar148;
  auVar29._12_4_ = fVar209 * fVar150;
  auVar29._16_4_ = fVar211 * fVar152;
  auVar29._20_4_ = fVar213 * fVar154;
  auVar29._24_4_ = fVar215 * fVar159;
  auVar29._28_4_ = local_b40._28_4_;
  auVar22 = vsubps_avx(auVar29,auVar28);
  auVar30._4_4_ = fVar177 * fVar146;
  auVar30._0_4_ = fVar174 * fVar144;
  auVar30._8_4_ = fVar179 * fVar148;
  auVar30._12_4_ = fVar181 * fVar150;
  auVar30._16_4_ = fVar183 * fVar152;
  auVar30._20_4_ = fVar185 * fVar154;
  auVar30._24_4_ = fVar187 * fVar159;
  auVar30._28_4_ = fVar171;
  auVar31._4_4_ = fVar226 * fVar133;
  auVar31._0_4_ = fVar223 * fVar132;
  auVar31._8_4_ = fVar228 * fVar134;
  auVar31._12_4_ = fVar230 * fVar135;
  auVar31._16_4_ = fVar232 * fVar136;
  auVar31._20_4_ = fVar234 * fVar137;
  auVar31._24_4_ = fVar236 * fVar138;
  auVar31._28_4_ = fVar173 + fVar91;
  auVar23 = vsubps_avx(auVar31,auVar30);
  local_b80._0_4_ =
       local_dc0._4_4_ * auVar21._0_4_ + local_de0._4_4_ * auVar22._0_4_ + fVar123 * auVar23._0_4_;
  local_b80._4_4_ =
       local_dc0._4_4_ * auVar21._4_4_ + local_de0._4_4_ * auVar22._4_4_ + fVar123 * auVar23._4_4_;
  fStack_b78 = local_dc0._4_4_ * auVar21._8_4_ +
               local_de0._4_4_ * auVar22._8_4_ + fVar123 * auVar23._8_4_;
  fStack_b74 = local_dc0._4_4_ * auVar21._12_4_ +
               local_de0._4_4_ * auVar22._12_4_ + fVar123 * auVar23._12_4_;
  register0x00001310 =
       local_dc0._4_4_ * auVar21._16_4_ +
       local_de0._4_4_ * auVar22._16_4_ + fVar123 * auVar23._16_4_;
  register0x00001314 =
       local_dc0._4_4_ * auVar21._20_4_ +
       local_de0._4_4_ * auVar22._20_4_ + fVar123 * auVar23._20_4_;
  register0x00001318 =
       local_dc0._4_4_ * auVar21._24_4_ +
       local_de0._4_4_ * auVar22._24_4_ + fVar123 * auVar23._24_4_;
  register0x0000131c = auVar21._28_4_ + auVar22._28_4_ + auVar23._28_4_;
  auVar21 = vsubps_avx(auVar83,auVar95);
  fVar138 = auVar83._0_4_ + auVar95._0_4_;
  fVar144 = auVar83._4_4_ + auVar95._4_4_;
  fVar146 = auVar83._8_4_ + auVar95._8_4_;
  fVar148 = auVar83._12_4_ + auVar95._12_4_;
  fVar150 = auVar83._16_4_ + auVar95._16_4_;
  fVar152 = auVar83._20_4_ + auVar95._20_4_;
  fVar154 = auVar83._24_4_ + auVar95._24_4_;
  fVar159 = auVar83._28_4_ + auVar95._28_4_;
  auVar83 = vsubps_avx(auVar104,auVar18);
  fVar91 = auVar104._0_4_ + auVar18._0_4_;
  fVar132 = auVar104._4_4_ + auVar18._4_4_;
  fVar133 = auVar104._8_4_ + auVar18._8_4_;
  fVar134 = auVar104._12_4_ + auVar18._12_4_;
  fVar135 = auVar104._16_4_ + auVar18._16_4_;
  fVar136 = auVar104._20_4_ + auVar18._20_4_;
  fVar137 = auVar104._24_4_ + auVar18._24_4_;
  auVar95 = vsubps_avx(auVar17,auVar19);
  fVar165 = auVar17._0_4_ + auVar19._0_4_;
  fVar166 = auVar17._4_4_ + auVar19._4_4_;
  fVar167 = auVar17._8_4_ + auVar19._8_4_;
  fVar168 = auVar17._12_4_ + auVar19._12_4_;
  fVar169 = auVar17._16_4_ + auVar19._16_4_;
  fVar170 = auVar17._20_4_ + auVar19._20_4_;
  fVar122 = auVar17._24_4_ + auVar19._24_4_;
  fVar139 = auVar95._0_4_;
  fVar145 = auVar95._4_4_;
  auVar32._4_4_ = fVar145 * fVar132;
  auVar32._0_4_ = fVar139 * fVar91;
  fVar147 = auVar95._8_4_;
  auVar32._8_4_ = fVar147 * fVar133;
  fVar149 = auVar95._12_4_;
  auVar32._12_4_ = fVar149 * fVar134;
  fVar151 = auVar95._16_4_;
  auVar32._16_4_ = fVar151 * fVar135;
  fVar153 = auVar95._20_4_;
  auVar32._20_4_ = fVar153 * fVar136;
  fVar155 = auVar95._24_4_;
  auVar32._24_4_ = fVar155 * fVar137;
  auVar32._28_4_ = fVar171;
  fVar171 = auVar83._0_4_;
  fVar178 = auVar83._4_4_;
  auVar33._4_4_ = fVar178 * fVar166;
  auVar33._0_4_ = fVar171 * fVar165;
  fVar180 = auVar83._8_4_;
  auVar33._8_4_ = fVar180 * fVar167;
  fVar182 = auVar83._12_4_;
  auVar33._12_4_ = fVar182 * fVar168;
  fVar184 = auVar83._16_4_;
  auVar33._16_4_ = fVar184 * fVar169;
  fVar186 = auVar83._20_4_;
  auVar33._20_4_ = fVar186 * fVar170;
  fVar188 = auVar83._24_4_;
  auVar33._24_4_ = fVar188 * fVar122;
  auVar33._28_4_ = fVar173;
  auVar83 = vsubps_avx(auVar33,auVar32);
  fVar216 = auVar21._0_4_;
  fVar218 = auVar21._4_4_;
  auVar34._4_4_ = fVar218 * fVar166;
  auVar34._0_4_ = fVar216 * fVar165;
  fVar165 = auVar21._8_4_;
  auVar34._8_4_ = fVar165 * fVar167;
  fVar166 = auVar21._12_4_;
  auVar34._12_4_ = fVar166 * fVar168;
  fVar167 = auVar21._16_4_;
  auVar34._16_4_ = fVar167 * fVar169;
  fVar168 = auVar21._20_4_;
  auVar34._20_4_ = fVar168 * fVar170;
  fVar169 = auVar21._24_4_;
  auVar34._24_4_ = fVar169 * fVar122;
  auVar34._28_4_ = auVar17._28_4_ + auVar19._28_4_;
  auVar17._4_4_ = fVar145 * fVar144;
  auVar17._0_4_ = fVar139 * fVar138;
  auVar17._8_4_ = fVar147 * fVar146;
  auVar17._12_4_ = fVar149 * fVar148;
  auVar17._16_4_ = fVar151 * fVar150;
  auVar17._20_4_ = fVar153 * fVar152;
  auVar17._24_4_ = fVar155 * fVar154;
  auVar17._28_4_ = fVar173;
  auVar104 = vsubps_avx(auVar17,auVar34);
  auVar19._4_4_ = fVar178 * fVar144;
  auVar19._0_4_ = fVar171 * fVar138;
  auVar19._8_4_ = fVar180 * fVar146;
  auVar19._12_4_ = fVar182 * fVar148;
  auVar19._16_4_ = fVar184 * fVar150;
  auVar19._20_4_ = fVar186 * fVar152;
  auVar19._24_4_ = fVar188 * fVar154;
  auVar19._28_4_ = fVar159;
  auVar35._4_4_ = fVar218 * fVar132;
  auVar35._0_4_ = fVar216 * fVar91;
  auVar35._8_4_ = fVar165 * fVar133;
  auVar35._12_4_ = fVar166 * fVar134;
  auVar35._16_4_ = fVar167 * fVar135;
  auVar35._20_4_ = fVar168 * fVar136;
  auVar35._24_4_ = fVar169 * fVar137;
  auVar35._28_4_ = fVar173 + auVar18._28_4_;
  auVar17 = vsubps_avx(auVar35,auVar19);
  local_de0._0_4_ = local_de0._4_4_;
  fStack_dd8 = local_de0._4_4_;
  fStack_dd4 = local_de0._4_4_;
  fStack_dd0 = local_de0._4_4_;
  fStack_dcc = local_de0._4_4_;
  fStack_dc8 = local_de0._4_4_;
  fStack_dc4 = local_de0._4_4_;
  local_dc0._0_4_ = local_dc0._4_4_;
  fStack_db8 = local_dc0._4_4_;
  fStack_db4 = local_dc0._4_4_;
  fStack_db0 = local_dc0._4_4_;
  fStack_dac = local_dc0._4_4_;
  fStack_da8 = local_dc0._4_4_;
  fStack_da4 = local_dc0._4_4_;
  auVar96._0_4_ =
       local_dc0._4_4_ * auVar83._0_4_ + local_de0._4_4_ * auVar104._0_4_ + fVar123 * auVar17._0_4_;
  auVar96._4_4_ =
       local_dc0._4_4_ * auVar83._4_4_ + local_de0._4_4_ * auVar104._4_4_ + fVar123 * auVar17._4_4_;
  auVar96._8_4_ =
       local_dc0._4_4_ * auVar83._8_4_ + local_de0._4_4_ * auVar104._8_4_ + fVar123 * auVar17._8_4_;
  auVar96._12_4_ =
       local_dc0._4_4_ * auVar83._12_4_ +
       local_de0._4_4_ * auVar104._12_4_ + fVar123 * auVar17._12_4_;
  auVar96._16_4_ =
       local_dc0._4_4_ * auVar83._16_4_ +
       local_de0._4_4_ * auVar104._16_4_ + fVar123 * auVar17._16_4_;
  auVar96._20_4_ =
       local_dc0._4_4_ * auVar83._20_4_ +
       local_de0._4_4_ * auVar104._20_4_ + fVar123 * auVar17._20_4_;
  auVar96._24_4_ =
       local_dc0._4_4_ * auVar83._24_4_ +
       local_de0._4_4_ * auVar104._24_4_ + fVar123 * auVar17._24_4_;
  auVar96._28_4_ = fVar159 + fVar159 + auVar17._28_4_;
  local_bc0._0_4_ = auVar96._0_4_ + local_b60._0_4_ + (float)local_b80._0_4_;
  local_bc0._4_4_ = auVar96._4_4_ + local_b60._4_4_ + (float)local_b80._4_4_;
  fStack_bb8 = auVar96._8_4_ + local_b60._8_4_ + fStack_b78;
  fStack_bb4 = auVar96._12_4_ + local_b60._12_4_ + fStack_b74;
  register0x00001210 = auVar96._16_4_ + local_b60._16_4_ + register0x00001310;
  register0x00001214 = auVar96._20_4_ + local_b60._20_4_ + register0x00001314;
  register0x00001218 = auVar96._24_4_ + local_b60._24_4_ + register0x00001318;
  register0x0000121c = auVar96._28_4_ + local_b60._28_4_ + register0x0000131c;
  auVar83 = vminps_avx(local_b60,_local_b80);
  auVar83 = vminps_avx(auVar83,auVar96);
  auVar119._8_4_ = 0x7fffffff;
  auVar119._0_8_ = 0x7fffffff7fffffff;
  auVar119._12_4_ = 0x7fffffff;
  auVar119._16_4_ = 0x7fffffff;
  auVar119._20_4_ = 0x7fffffff;
  auVar119._24_4_ = 0x7fffffff;
  auVar119._28_4_ = 0x7fffffff;
  _local_ba0 = vandps_avx(_local_bc0,auVar119);
  fVar91 = local_ba0._0_4_ * 1.1920929e-07;
  fVar132 = local_ba0._4_4_ * 1.1920929e-07;
  auVar18._4_4_ = fVar132;
  auVar18._0_4_ = fVar91;
  fVar133 = local_ba0._8_4_ * 1.1920929e-07;
  auVar18._8_4_ = fVar133;
  fVar134 = local_ba0._12_4_ * 1.1920929e-07;
  auVar18._12_4_ = fVar134;
  fVar135 = local_ba0._16_4_ * 1.1920929e-07;
  auVar18._16_4_ = fVar135;
  fVar136 = local_ba0._20_4_ * 1.1920929e-07;
  auVar18._20_4_ = fVar136;
  fVar137 = local_ba0._24_4_ * 1.1920929e-07;
  auVar18._24_4_ = fVar137;
  auVar18._28_4_ = 0x34000000;
  auVar162._0_8_ = CONCAT44(fVar132,fVar91) ^ 0x8000000080000000;
  auVar162._8_4_ = -fVar133;
  auVar162._12_4_ = -fVar134;
  auVar162._16_4_ = -fVar135;
  auVar162._20_4_ = -fVar136;
  auVar162._24_4_ = -fVar137;
  auVar162._28_4_ = 0xb4000000;
  auVar83 = vcmpps_avx(auVar83,auVar162,5);
  auVar17 = vmaxps_avx(local_b60,_local_b80);
  auVar104 = vmaxps_avx(auVar17,auVar96);
  auVar104 = vcmpps_avx(auVar104,auVar18,2);
  auVar104 = vorps_avx(auVar83,auVar104);
  if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar104 >> 0x7f,0) == '\0') &&
        (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar104 >> 0xbf,0) == '\0') &&
      (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar104[0x1f]) {
LAB_00b7e80b:
    auVar164 = ZEXT1664(local_ce0);
    auVar172 = ZEXT1664(local_cf0);
    auVar176 = ZEXT1664(local_d00);
    auVar190 = ZEXT1664(local_d10);
    auVar193 = ZEXT1664(local_d20);
    auVar203 = ZEXT1664(local_d30);
    auVar217 = ZEXT1664(local_d40);
    auVar221 = ZEXT1664(local_d50);
    auVar224 = ZEXT1664(local_d60);
    auVar143 = ZEXT1664(local_d70);
  }
  else {
    local_be0 = auVar104;
    auVar36._4_4_ = fVar177 * fVar84;
    auVar36._0_4_ = fVar174 * fVar80;
    auVar36._8_4_ = fVar179 * fVar85;
    auVar36._12_4_ = fVar181 * fVar86;
    auVar36._16_4_ = fVar183 * fVar87;
    auVar36._20_4_ = fVar185 * fVar88;
    auVar36._24_4_ = fVar187 * fVar89;
    auVar36._28_4_ = auVar83._28_4_;
    auVar37._4_4_ = fVar205 * fVar204;
    auVar37._0_4_ = fVar201 * fVar200;
    auVar37._8_4_ = fVar207 * fVar206;
    auVar37._12_4_ = fVar209 * fVar208;
    auVar37._16_4_ = fVar211 * fVar210;
    auVar37._20_4_ = fVar213 * fVar212;
    auVar37._24_4_ = fVar215 * fVar214;
    auVar37._28_4_ = 0x34000000;
    auVar18 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar205 * fVar178;
    auVar38._0_4_ = fVar201 * fVar171;
    auVar38._8_4_ = fVar207 * fVar180;
    auVar38._12_4_ = fVar209 * fVar182;
    auVar38._16_4_ = fVar211 * fVar184;
    auVar38._20_4_ = fVar213 * fVar186;
    auVar38._24_4_ = fVar215 * fVar188;
    auVar38._28_4_ = auVar17._28_4_;
    auVar39._4_4_ = fVar177 * fVar145;
    auVar39._0_4_ = fVar174 * fVar139;
    auVar39._8_4_ = fVar179 * fVar147;
    auVar39._12_4_ = fVar181 * fVar149;
    auVar39._16_4_ = fVar183 * fVar151;
    auVar39._20_4_ = fVar185 * fVar153;
    auVar39._24_4_ = fVar187 * fVar155;
    auVar39._28_4_ = auVar20._28_4_;
    auVar19 = vsubps_avx(auVar39,auVar38);
    auVar131._8_4_ = 0x7fffffff;
    auVar131._0_8_ = 0x7fffffff7fffffff;
    auVar131._12_4_ = 0x7fffffff;
    auVar131._16_4_ = 0x7fffffff;
    auVar131._20_4_ = 0x7fffffff;
    auVar131._24_4_ = 0x7fffffff;
    auVar131._28_4_ = 0x7fffffff;
    auVar83 = vandps_avx(auVar36,auVar131);
    auVar17 = vandps_avx(auVar38,auVar131);
    auVar83 = vcmpps_avx(auVar83,auVar17,1);
    local_960 = vblendvps_avx(auVar19,auVar18,auVar83);
    auVar40._4_4_ = fVar226 * fVar145;
    auVar40._0_4_ = fVar223 * fVar139;
    auVar40._8_4_ = fVar228 * fVar147;
    auVar40._12_4_ = fVar230 * fVar149;
    auVar40._16_4_ = fVar232 * fVar151;
    auVar40._20_4_ = fVar234 * fVar153;
    auVar40._24_4_ = fVar236 * fVar155;
    auVar40._28_4_ = auVar83._28_4_;
    auVar41._4_4_ = fVar226 * fVar84;
    auVar41._0_4_ = fVar223 * fVar80;
    auVar41._8_4_ = fVar228 * fVar85;
    auVar41._12_4_ = fVar230 * fVar86;
    auVar41._16_4_ = fVar232 * fVar87;
    auVar41._20_4_ = fVar234 * fVar88;
    auVar41._24_4_ = fVar236 * fVar89;
    auVar41._28_4_ = auVar18._28_4_;
    auVar42._4_4_ = fVar194 * fVar205;
    auVar42._0_4_ = fVar191 * fVar201;
    auVar42._8_4_ = fVar195 * fVar207;
    auVar42._12_4_ = fVar196 * fVar209;
    auVar42._16_4_ = fVar197 * fVar211;
    auVar42._20_4_ = fVar198 * fVar213;
    auVar42._24_4_ = fVar199 * fVar215;
    auVar42._28_4_ = fVar123;
    auVar18 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = fVar205 * fVar218;
    auVar43._0_4_ = fVar201 * fVar216;
    auVar43._8_4_ = fVar207 * fVar165;
    auVar43._12_4_ = fVar209 * fVar166;
    auVar43._16_4_ = fVar211 * fVar167;
    auVar43._20_4_ = fVar213 * fVar168;
    auVar43._24_4_ = fVar215 * fVar169;
    auVar43._28_4_ = auVar17._28_4_;
    auVar19 = vsubps_avx(auVar43,auVar40);
    auVar83 = vandps_avx(auVar42,auVar131);
    auVar17 = vandps_avx(auVar40,auVar131);
    auVar83 = vcmpps_avx(auVar83,auVar17,1);
    local_940 = vblendvps_avx(auVar19,auVar18,auVar83);
    auVar44._4_4_ = fVar177 * fVar218;
    auVar44._0_4_ = fVar174 * fVar216;
    auVar44._8_4_ = fVar179 * fVar165;
    auVar44._12_4_ = fVar181 * fVar166;
    auVar44._16_4_ = fVar183 * fVar167;
    auVar44._20_4_ = fVar185 * fVar168;
    auVar44._24_4_ = fVar187 * fVar169;
    auVar44._28_4_ = auVar83._28_4_;
    auVar45._4_4_ = fVar194 * fVar177;
    auVar45._0_4_ = fVar191 * fVar174;
    auVar45._8_4_ = fVar195 * fVar179;
    auVar45._12_4_ = fVar196 * fVar181;
    auVar45._16_4_ = fVar197 * fVar183;
    auVar45._20_4_ = fVar198 * fVar185;
    auVar45._24_4_ = fVar199 * fVar187;
    auVar45._28_4_ = auVar18._28_4_;
    auVar46._4_4_ = fVar226 * fVar204;
    auVar46._0_4_ = fVar223 * fVar200;
    auVar46._8_4_ = fVar228 * fVar206;
    auVar46._12_4_ = fVar230 * fVar208;
    auVar46._16_4_ = fVar232 * fVar210;
    auVar46._20_4_ = fVar234 * fVar212;
    auVar46._24_4_ = fVar236 * fVar214;
    auVar46._28_4_ = auVar95._28_4_;
    auVar47._4_4_ = fVar226 * fVar178;
    auVar47._0_4_ = fVar223 * fVar171;
    auVar47._8_4_ = fVar228 * fVar180;
    auVar47._12_4_ = fVar230 * fVar182;
    auVar47._16_4_ = fVar232 * fVar184;
    auVar47._20_4_ = fVar234 * fVar186;
    auVar47._24_4_ = fVar236 * fVar188;
    auVar47._28_4_ = uStack_b04;
    auVar95 = vsubps_avx(auVar45,auVar46);
    auVar18 = vsubps_avx(auVar47,auVar44);
    auVar83 = vandps_avx(auVar46,auVar131);
    auVar17 = vandps_avx(auVar44,auVar131);
    auVar17 = vcmpps_avx(auVar83,auVar17,1);
    local_920 = vblendvps_avx(auVar18,auVar95,auVar17);
    auVar94 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
    fVar80 = local_920._0_4_;
    fVar84 = local_920._4_4_;
    fVar85 = local_920._8_4_;
    fVar86 = local_920._12_4_;
    fVar87 = local_920._16_4_;
    fVar88 = local_920._20_4_;
    fVar89 = local_920._24_4_;
    fVar138 = local_940._0_4_;
    fVar144 = local_940._4_4_;
    fVar146 = local_940._8_4_;
    fVar148 = local_940._12_4_;
    fVar150 = local_940._16_4_;
    fVar152 = local_940._20_4_;
    fVar154 = local_940._24_4_;
    fVar159 = local_960._0_4_;
    fVar165 = local_960._4_4_;
    fVar166 = local_960._8_4_;
    fVar167 = local_960._12_4_;
    fVar168 = local_960._16_4_;
    fVar169 = local_960._20_4_;
    fVar170 = local_960._24_4_;
    fVar91 = fVar159 * local_dc0._4_4_ + fVar138 * local_de0._4_4_ + fVar80 * fVar123;
    fVar132 = fVar165 * local_dc0._4_4_ + fVar144 * local_de0._4_4_ + fVar84 * fVar123;
    fVar133 = fVar166 * local_dc0._4_4_ + fVar146 * local_de0._4_4_ + fVar85 * fVar123;
    fVar134 = fVar167 * local_dc0._4_4_ + fVar148 * local_de0._4_4_ + fVar86 * fVar123;
    fVar135 = fVar168 * local_dc0._4_4_ + fVar150 * local_de0._4_4_ + fVar87 * fVar123;
    fVar136 = fVar169 * local_dc0._4_4_ + fVar152 * local_de0._4_4_ + fVar88 * fVar123;
    fVar123 = fVar170 * local_dc0._4_4_ + fVar154 * local_de0._4_4_ + fVar89 * fVar123;
    fVar137 = auVar95._28_4_ + auVar95._28_4_ + 0.0;
    auVar120._0_4_ = fVar91 + fVar91;
    auVar120._4_4_ = fVar132 + fVar132;
    auVar120._8_4_ = fVar133 + fVar133;
    auVar120._12_4_ = fVar134 + fVar134;
    auVar120._16_4_ = fVar135 + fVar135;
    auVar120._20_4_ = fVar136 + fVar136;
    auVar120._24_4_ = fVar123 + fVar123;
    auVar120._28_4_ = fVar137 + fVar137;
    fVar91 = auVar83._28_4_;
    auVar83 = vrcpps_avx(auVar120);
    fVar132 = fVar159 * fVar15 + fVar138 * fVar14 + fVar80 * fVar222;
    fVar133 = fVar165 * fVar90 + fVar144 * fVar16 + fVar84 * fVar225;
    fVar134 = fVar166 * fVar98 + fVar146 * fVar97 + fVar85 * fVar227;
    fVar107 = fVar167 * fVar108 + fVar148 * fVar107 + fVar86 * fVar229;
    fVar108 = fVar168 * fVar110 + fVar150 * fVar109 + fVar87 * fVar231;
    fVar109 = fVar169 * fVar11 + fVar152 * fVar111 + fVar88 * fVar233;
    fVar110 = fVar170 * fVar13 + fVar154 * fVar12 + fVar89 * fVar235;
    fVar111 = fVar91 + fVar91 + fVar137;
    fVar123 = auVar83._0_4_;
    fVar14 = auVar83._4_4_;
    auVar48._4_4_ = auVar120._4_4_ * fVar14;
    auVar48._0_4_ = auVar120._0_4_ * fVar123;
    fVar15 = auVar83._8_4_;
    auVar48._8_4_ = auVar120._8_4_ * fVar15;
    fVar16 = auVar83._12_4_;
    auVar48._12_4_ = auVar120._12_4_ * fVar16;
    fVar90 = auVar83._16_4_;
    auVar48._16_4_ = auVar120._16_4_ * fVar90;
    fVar97 = auVar83._20_4_;
    auVar48._20_4_ = auVar120._20_4_ * fVar97;
    fVar98 = auVar83._24_4_;
    auVar48._24_4_ = auVar120._24_4_ * fVar98;
    auVar48._28_4_ = fVar91;
    auVar163._8_4_ = 0x3f800000;
    auVar163._0_8_ = 0x3f8000003f800000;
    auVar163._12_4_ = 0x3f800000;
    auVar163._16_4_ = 0x3f800000;
    auVar163._20_4_ = 0x3f800000;
    auVar163._24_4_ = 0x3f800000;
    auVar163._28_4_ = 0x3f800000;
    auVar83 = vsubps_avx(auVar163,auVar48);
    uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar157._4_4_ = uVar3;
    auVar157._0_4_ = uVar3;
    auVar157._8_4_ = uVar3;
    auVar157._12_4_ = uVar3;
    auVar157._16_4_ = uVar3;
    auVar157._20_4_ = uVar3;
    auVar157._24_4_ = uVar3;
    auVar157._28_4_ = uVar3;
    local_8a0._4_4_ = (fVar133 + fVar133) * (fVar14 + fVar14 * auVar83._4_4_);
    local_8a0._0_4_ = (fVar132 + fVar132) * (fVar123 + fVar123 * auVar83._0_4_);
    local_8a0._8_4_ = (fVar134 + fVar134) * (fVar15 + fVar15 * auVar83._8_4_);
    local_8a0._12_4_ = (fVar107 + fVar107) * (fVar16 + fVar16 * auVar83._12_4_);
    local_8a0._16_4_ = (fVar108 + fVar108) * (fVar90 + fVar90 * auVar83._16_4_);
    local_8a0._20_4_ = (fVar109 + fVar109) * (fVar97 + fVar97 * auVar83._20_4_);
    local_8a0._24_4_ = (fVar110 + fVar110) * (fVar98 + fVar98 * auVar83._24_4_);
    local_8a0._28_4_ = fVar111 + fVar111;
    auVar83 = vcmpps_avx(auVar157,local_8a0,2);
    fVar123 = ray->tfar;
    auVar158._4_4_ = fVar123;
    auVar158._0_4_ = fVar123;
    auVar158._8_4_ = fVar123;
    auVar158._12_4_ = fVar123;
    auVar158._16_4_ = fVar123;
    auVar158._20_4_ = fVar123;
    auVar158._24_4_ = fVar123;
    auVar158._28_4_ = fVar123;
    auVar104 = vcmpps_avx(local_8a0,auVar158,2);
    auVar83 = vandps_avx(auVar104,auVar83);
    auVar104 = vcmpps_avx(auVar120,_DAT_01f7b000,4);
    auVar83 = vandps_avx(auVar83,auVar104);
    auVar124 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
    auVar94 = vpand_avx(auVar124,auVar94);
    auVar124 = vpmovsxwd_avx(auVar94);
    auVar81 = vpshufd_avx(auVar94,0xee);
    auVar81 = vpmovsxwd_avx(auVar81);
    local_900._16_16_ = auVar81;
    local_900._0_16_ = auVar124;
    if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_900 >> 0x7f,0) == '\0') &&
          (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB161(auVar81 >> 0x3f,0) == '\0') &&
        (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar81[0xf])
    goto LAB_00b7e80b;
    local_9c0 = local_b60._0_4_;
    fStack_9bc = local_b60._4_4_;
    fStack_9b8 = local_b60._8_4_;
    fStack_9b4 = local_b60._12_4_;
    fStack_9b0 = local_b60._16_4_;
    fStack_9ac = local_b60._20_4_;
    fStack_9a8 = local_b60._24_4_;
    fStack_9a4 = local_b60._28_4_;
    local_9a0 = (float)local_b80._0_4_;
    fStack_99c = (float)local_b80._4_4_;
    fStack_998 = fStack_b78;
    fStack_994 = fStack_b74;
    fStack_990 = register0x00001310;
    fStack_98c = register0x00001314;
    fStack_988 = register0x00001318;
    fStack_984 = register0x0000131c;
    local_980 = _local_bc0;
    local_820 = local_a20;
    auVar83 = vrcpps_avx(_local_bc0);
    fVar123 = auVar83._0_4_;
    fVar14 = auVar83._4_4_;
    auVar49._4_4_ = (float)local_bc0._4_4_ * fVar14;
    auVar49._0_4_ = (float)local_bc0._0_4_ * fVar123;
    fVar15 = auVar83._8_4_;
    auVar49._8_4_ = fStack_bb8 * fVar15;
    fVar16 = auVar83._12_4_;
    auVar49._12_4_ = fStack_bb4 * fVar16;
    fVar90 = auVar83._16_4_;
    auVar49._16_4_ = register0x00001210 * fVar90;
    fVar97 = auVar83._20_4_;
    auVar49._20_4_ = register0x00001214 * fVar97;
    fVar98 = auVar83._24_4_;
    auVar49._24_4_ = register0x00001218 * fVar98;
    auVar49._28_4_ = auVar81._12_4_;
    auVar142._8_4_ = 0x3f800000;
    auVar142._0_8_ = 0x3f8000003f800000;
    auVar142._12_4_ = 0x3f800000;
    auVar142._16_4_ = 0x3f800000;
    auVar142._20_4_ = 0x3f800000;
    auVar142._24_4_ = 0x3f800000;
    auVar142._28_4_ = 0x3f800000;
    auVar104 = vsubps_avx(auVar142,auVar49);
    auVar106._0_4_ = fVar123 + fVar123 * auVar104._0_4_;
    auVar106._4_4_ = fVar14 + fVar14 * auVar104._4_4_;
    auVar106._8_4_ = fVar15 + fVar15 * auVar104._8_4_;
    auVar106._12_4_ = fVar16 + fVar16 * auVar104._12_4_;
    auVar106._16_4_ = fVar90 + fVar90 * auVar104._16_4_;
    auVar106._20_4_ = fVar97 + fVar97 * auVar104._20_4_;
    auVar106._24_4_ = fVar98 + fVar98 * auVar104._24_4_;
    auVar106._28_4_ = auVar83._28_4_ + auVar104._28_4_;
    auVar121._8_4_ = 0x219392ef;
    auVar121._0_8_ = 0x219392ef219392ef;
    auVar121._12_4_ = 0x219392ef;
    auVar121._16_4_ = 0x219392ef;
    auVar121._20_4_ = 0x219392ef;
    auVar121._24_4_ = 0x219392ef;
    auVar121._28_4_ = 0x219392ef;
    auVar104 = vcmpps_avx(_local_ba0,auVar121,5);
    auVar83 = vandps_avx(auVar104,auVar106);
    auVar50._4_4_ = local_b60._4_4_ * auVar83._4_4_;
    auVar50._0_4_ = local_b60._0_4_ * auVar83._0_4_;
    auVar50._8_4_ = local_b60._8_4_ * auVar83._8_4_;
    auVar50._12_4_ = local_b60._12_4_ * auVar83._12_4_;
    auVar50._16_4_ = local_b60._16_4_ * auVar83._16_4_;
    auVar50._20_4_ = local_b60._20_4_ * auVar83._20_4_;
    auVar50._24_4_ = local_b60._24_4_ * auVar83._24_4_;
    auVar50._28_4_ = auVar104._28_4_;
    auVar104 = vminps_avx(auVar50,auVar142);
    auVar51._4_4_ = (float)local_b80._4_4_ * auVar83._4_4_;
    auVar51._0_4_ = (float)local_b80._0_4_ * auVar83._0_4_;
    auVar51._8_4_ = fStack_b78 * auVar83._8_4_;
    auVar51._12_4_ = fStack_b74 * auVar83._12_4_;
    auVar51._16_4_ = register0x00001310 * auVar83._16_4_;
    auVar51._20_4_ = register0x00001314 * auVar83._20_4_;
    auVar51._24_4_ = register0x00001318 * auVar83._24_4_;
    auVar51._28_4_ = auVar83._28_4_;
    auVar83 = vminps_avx(auVar51,auVar142);
    auVar17 = vsubps_avx(auVar142,auVar104);
    auVar95 = vsubps_avx(auVar142,auVar83);
    local_8c0 = vblendvps_avx(auVar83,auVar17,local_a20);
    local_8e0 = vblendvps_avx(auVar104,auVar95,local_a20);
    fVar123 = local_a40._0_4_;
    fVar14 = local_a40._4_4_;
    local_880._4_4_ = fVar165 * fVar14;
    local_880._0_4_ = fVar159 * fVar123;
    fVar15 = local_a40._8_4_;
    local_880._8_4_ = fVar166 * fVar15;
    fVar16 = local_a40._12_4_;
    local_880._12_4_ = fVar167 * fVar16;
    fVar90 = local_a40._16_4_;
    local_880._16_4_ = fVar168 * fVar90;
    fVar97 = local_a40._20_4_;
    local_880._20_4_ = fVar169 * fVar97;
    fVar98 = local_a40._24_4_;
    local_880._24_4_ = fVar170 * fVar98;
    local_880._28_4_ = local_8c0._28_4_;
    local_860._4_4_ = fVar144 * fVar14;
    local_860._0_4_ = fVar138 * fVar123;
    local_860._8_4_ = fVar146 * fVar15;
    local_860._12_4_ = fVar148 * fVar16;
    local_860._16_4_ = fVar150 * fVar90;
    local_860._20_4_ = fVar152 * fVar97;
    local_860._24_4_ = fVar154 * fVar98;
    local_860._28_4_ = local_8e0._28_4_;
    local_840[0] = fVar123 * fVar80;
    local_840[1] = fVar14 * fVar84;
    local_840[2] = fVar15 * fVar85;
    local_840[3] = fVar16 * fVar86;
    fStack_830 = fVar90 * fVar87;
    fStack_82c = fVar97 * fVar88;
    fStack_828 = fVar98 * fVar89;
    uStack_824 = local_920._28_4_;
    auVar94 = vpsllw_avx(auVar94,0xf);
    auVar94 = vpacksswb_avx(auVar94,auVar94);
    uVar55 = (ulong)(byte)(SUB161(auVar94 >> 7,0) & 1 | (SUB161(auVar94 >> 0xf,0) & 1) << 1 |
                           (SUB161(auVar94 >> 0x17,0) & 1) << 2 |
                           (SUB161(auVar94 >> 0x1f,0) & 1) << 3 |
                           (SUB161(auVar94 >> 0x27,0) & 1) << 4 |
                           (SUB161(auVar94 >> 0x2f,0) & 1) << 5 |
                           (SUB161(auVar94 >> 0x37,0) & 1) << 6 | SUB161(auVar94 >> 0x3f,0) << 7);
    auVar164 = ZEXT1664(local_ce0);
    auVar172 = ZEXT1664(local_cf0);
    auVar176 = ZEXT1664(local_d00);
    auVar190 = ZEXT1664(local_d10);
    auVar193 = ZEXT1664(local_d20);
    auVar203 = ZEXT1664(local_d30);
    auVar217 = ZEXT1664(local_d40);
    auVar221 = ZEXT1664(local_d50);
    auVar224 = ZEXT1664(local_d60);
    auVar143 = ZEXT1664(local_d70);
    _local_d90 = auVar117;
    _local_d80 = auVar127;
    _local_b20 = auVar105;
    _local_a90 = auVar128;
    _local_a80 = auVar52;
    _local_a70 = auVar53;
    _local_a60 = auVar54;
    do {
      uVar59 = 0;
      if (uVar55 != 0) {
        for (; (uVar55 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
        }
      }
      local_c88 = *(uint *)((long)&local_9e0 + uVar59 * 4);
      pGVar7 = (pSVar70->geometries).items[local_c88].ptr;
      if ((pGVar7->mask & ray->mask) == 0) {
        uVar55 = uVar55 ^ 1L << (uVar59 & 0x3f);
      }
      else {
        local_de0 = uVar59;
        local_dc0 = uVar55;
        pRVar77 = local_de8->args;
        if ((pRVar77->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b7e8a7;
        local_c70.context = local_de8->user;
        local_ca0 = *(undefined4 *)(local_880 + uVar59 * 4);
        local_c9c = *(undefined4 *)(local_860 + uVar59 * 4);
        local_c98 = local_840[uVar59];
        local_c94 = *(undefined4 *)(local_8e0 + uVar59 * 4);
        local_c90 = *(undefined4 *)(local_8c0 + uVar59 * 4);
        local_c8c = *(undefined4 *)((long)&local_a00 + uVar59 * 4);
        local_c84 = (local_c70.context)->instID[0];
        local_c80 = (local_c70.context)->instPrimID[0];
        local_c00._0_4_ = ray->tfar;
        ray->tfar = *(float *)(local_8a0 + uVar59 * 4);
        local_df4 = -1;
        local_c70.valid = &local_df4;
        local_c70.geometryUserPtr = pGVar7->userPtr;
        local_c70.hit = (RTCHitN *)&local_ca0;
        local_c70.N = 1;
        local_c20._0_8_ = pGVar7;
        local_c70.ray = (RTCRayN *)ray;
        if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b7e712:
          if ((pRVar77->filter == (RTCFilterFunctionN)0x0) ||
             ((((pRVar77->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                RTC_RAY_QUERY_FLAG_INCOHERENT && ((*(byte *)(local_c20._0_8_ + 0x3e) & 0x40) == 0))
              || ((*pRVar77->filter)(&local_c70), *local_c70.valid != 0)))) {
LAB_00b7e8a7:
            ray->tfar = -INFINITY;
            return;
          }
        }
        else {
          local_c40._0_8_ = pRVar77;
          (*pGVar7->occlusionFilterN)(&local_c70);
          pRVar77 = (RTCIntersectArguments *)local_c40._0_8_;
          if (*local_c70.valid != 0) goto LAB_00b7e712;
        }
        ray->tfar = (float)local_c00._0_4_;
        uVar55 = local_dc0 ^ 1L << (local_de0 & 0x3f);
        auVar164 = ZEXT1664(local_ce0);
        auVar172 = ZEXT1664(local_cf0);
        auVar176 = ZEXT1664(local_d00);
        auVar190 = ZEXT1664(local_d10);
        auVar193 = ZEXT1664(local_d20);
        auVar203 = ZEXT1664(local_d30);
        auVar217 = ZEXT1664(local_d40);
        auVar221 = ZEXT1664(local_d50);
        auVar224 = ZEXT1664(local_d60);
        auVar143 = ZEXT1664(local_d70);
        pSVar70 = local_df0;
      }
    } while (uVar55 != 0);
  }
  lVar63 = lVar63 + 1;
  goto LAB_00b7dac3;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }